

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O0

void __thiscall sf::priv::GlxContext::~GlxContext(GlxContext *this)

{
  long lVar1;
  long lVar2;
  GLXPbuffer GVar3;
  long lVar4;
  undefined8 uVar5;
  GLXContext p_Var6;
  GlContext *in_RDI;
  Display *unaff_retaddr;
  
  in_RDI->_vptr_GlContext = (_func_int **)&PTR__GlxContext_00493ca0;
  GlContext::cleanupUnsharedResources(&this->super_GlContext);
  lVar1._0_4_ = in_RDI[1].m_settings.antialiasingLevel;
  lVar1._4_4_ = in_RDI[1].m_settings.majorVersion;
  if (lVar1 != 0) {
    p_Var6 = (*sf_glad_glXGetCurrentContext)();
    if (p_Var6 == *(GLXContext *)&in_RDI[1].m_settings.antialiasingLevel) {
      (*sf_glad_glXMakeCurrent)((Display *)in_RDI[1]._vptr_GlContext,0,(GLXContext)0x0);
    }
    (*sf_glad_glXDestroyContext)
              ((Display *)in_RDI[1]._vptr_GlContext,
               *(GLXContext *)&in_RDI[1].m_settings.antialiasingLevel);
  }
  lVar2._0_4_ = in_RDI[1].m_settings.minorVersion;
  lVar2._4_4_ = in_RDI[1].m_settings.attributeFlags;
  if (lVar2 != 0) {
    GVar3._0_4_ = in_RDI[1].m_settings.minorVersion;
    GVar3._4_4_ = in_RDI[1].m_settings.attributeFlags;
    (*sf_glad_glXDestroyPbuffer)((Display *)in_RDI[1]._vptr_GlContext,GVar3);
  }
  lVar4._0_4_ = in_RDI[1].m_settings.depthBits;
  lVar4._4_4_ = in_RDI[1].m_settings.stencilBits;
  if ((lVar4 != 0) && ((in_RDI[1].m_settings.sRgbCapable & 1U) != 0)) {
    uVar5._0_4_ = in_RDI[1].m_settings.depthBits;
    uVar5._4_4_ = in_RDI[1].m_settings.stencilBits;
    XDestroyWindow(in_RDI[1]._vptr_GlContext,uVar5);
    XFlush(in_RDI[1]._vptr_GlContext);
  }
  CloseDisplay(unaff_retaddr);
  GlContext::~GlContext(in_RDI);
  return;
}

Assistant:

GlxContext::~GlxContext()
{
    // Notify unshared OpenGL resources of context destruction
    cleanupUnsharedResources();

    // Destroy the context
    if (m_context)
    {
#if defined(GLX_DEBUGGING)
        GlxErrorHandler handler(m_display);
#endif

        if (glXGetCurrentContext() == m_context)
            glXMakeCurrent(m_display, None, NULL);
        glXDestroyContext(m_display, m_context);

#if defined(GLX_DEBUGGING)
        if (glxErrorOccurred)
            err() << "GLX error in GlxContext::~GlxContext()" << std::endl;
#endif
    }

    if (m_pbuffer)
    {
        glXDestroyPbuffer(m_display, m_pbuffer);
    }

    // Destroy the window if we own it
    if (m_window && m_ownsWindow)
    {
        XDestroyWindow(m_display, m_window);
        XFlush(m_display);
    }

    // Close the connection with the X server
    CloseDisplay(m_display);
}